

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

void __thiscall HighsLp::clearScale(HighsLp *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x208) = 0;
  *(undefined1 *)(in_RDI + 0x20c) = 0;
  *(undefined4 *)(in_RDI + 0x210) = 0;
  *(undefined4 *)(in_RDI + 0x214) = 0;
  *(undefined8 *)(in_RDI + 0x218) = 0;
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x4f2093);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x4f20a8);
  return;
}

Assistant:

void HighsLp::clearScale() {
  this->scale_.strategy = kSimplexScaleStrategyOff;
  this->scale_.has_scaling = false;
  this->scale_.num_col = 0;
  this->scale_.num_row = 0;
  this->scale_.cost = 0;
  this->scale_.col.clear();
  this->scale_.row.clear();
}